

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_unittest.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::TestSameTypeMap::Clear(TestSameTypeMap *this)

{
  google::protobuf::internal::MapFieldBase::Clear((MapFieldBase *)&(this->field_0)._impl_);
  google::protobuf::internal::MapFieldBase::Clear((MapFieldBase *)&(this->field_0)._impl_.map2_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestSameTypeMap::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestSameTypeMap)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.map1_.Clear();
  _impl_.map2_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}